

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

void __thiscall CgroupController::delay_enter(CgroupController *this)

{
  int iVar1;
  ContextManager *pCVar2;
  path local_60;
  path path;
  
  if (this->enter_fd_ == -1) {
    std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
              (&local_60,(char (*) [6])"tasks",auto_format);
    std::filesystem::__cxx11::operator/(&path,&this->path_,&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    iVar1 = open(path._M_pathname._M_dataplus._M_p,0x80001);
    this->enter_fd_ = iVar1;
    if (iVar1 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_60._M_pathname,"Cannot open file \'%s\' for writing: %m",
                        path._M_pathname._M_dataplus._M_p);
      (**pCVar2->_vptr_ContextManager)(pCVar2,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::filesystem::__cxx11::path::~path(&path);
  }
  return;
}

Assistant:

void CgroupController::delay_enter() {
    if (enter_fd_ != -1) {
        return;
    }
    fs::path path = path_ / "tasks";
    enter_fd_ = open(path.c_str(), O_WRONLY | O_CLOEXEC);
    if (enter_fd_ < 0) {
        die(format("Cannot open file '%s' for writing: %m", path.c_str()));
    }
}